

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *vec,int *nonz,int rn)

{
  int iVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  cpp_dec_float<200U,_int,_void> *pcVar4;
  bool bVar5;
  type_conflict5 tVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  int *piVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  byte bVar21;
  int local_4a0;
  int rn_local;
  int *local_498;
  int local_48c;
  int *local_488;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_480;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_478;
  int *local_470;
  int *local_468;
  int *local_460;
  pointer local_458;
  ulong local_450;
  int *local_448;
  int *local_440;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> local_3b8;
  cpp_dec_float<200U,_int,_void> local_338;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar21 = 0;
  local_3b8.data._M_elems[0x18] = 0;
  local_3b8.data._M_elems[0x19] = 0;
  local_3b8.data._M_elems._104_5_ = 0;
  local_3b8.data._M_elems[0x14] = 0;
  local_3b8.data._M_elems[0x15] = 0;
  local_3b8.data._M_elems[0x16] = 0;
  local_3b8.data._M_elems[0x17] = 0;
  local_3b8.data._M_elems[0x10] = 0;
  local_3b8.data._M_elems[0x11] = 0;
  local_3b8.data._M_elems[0x12] = 0;
  local_3b8.data._M_elems[0x13] = 0;
  local_3b8.data._M_elems[0xc] = 0;
  local_3b8.data._M_elems[0xd] = 0;
  local_3b8.data._M_elems[0xe] = 0;
  local_3b8.data._M_elems[0xf] = 0;
  local_3b8.data._M_elems[8] = 0;
  local_3b8.data._M_elems[9] = 0;
  local_3b8.data._M_elems[10] = 0;
  local_3b8.data._M_elems[0xb] = 0;
  local_3b8.data._M_elems[4] = 0;
  local_3b8.data._M_elems[5] = 0;
  local_3b8.data._M_elems[6] = 0;
  local_3b8.data._M_elems[7] = 0;
  local_3b8.data._M_elems[0] = 0;
  local_3b8.data._M_elems[1] = 0;
  local_3b8.data._M_elems[2] = 0;
  local_3b8.data._M_elems[3] = 0;
  local_3b8.data._M_elems[0x1b]._1_3_ = 0;
  local_3b8.exp = 0;
  local_3b8.neg = false;
  local_3b8.prec_elem = 0x1c;
  local_338.fpclass = cpp_dec_float_finite;
  local_338.prec_elem = 0x1c;
  local_338.data._M_elems[0] = 0;
  local_338.data._M_elems[1] = 0;
  local_338.data._M_elems[2] = 0;
  local_338.data._M_elems[3] = 0;
  local_338.data._M_elems[4] = 0;
  local_338.data._M_elems[5] = 0;
  local_338.data._M_elems[6] = 0;
  local_338.data._M_elems[7] = 0;
  local_338.data._M_elems[8] = 0;
  local_338.data._M_elems[9] = 0;
  local_338.data._M_elems[10] = 0;
  local_338.data._M_elems[0xb] = 0;
  local_338.data._M_elems[0xc] = 0;
  local_338.data._M_elems[0xd] = 0;
  local_338.data._M_elems[0xe] = 0;
  local_338.data._M_elems[0xf] = 0;
  local_338.data._M_elems[0x18] = 0;
  local_338.data._M_elems[0x19] = 0;
  local_338.data._M_elems._104_5_ = 0;
  local_338.data._M_elems[0x1b]._1_3_ = 0;
  local_338.exp = 0;
  local_338.neg = false;
  local_338.data._M_elems[0x10] = 0;
  local_338.data._M_elems[0x11] = 0;
  local_338.data._M_elems[0x12] = 0;
  local_338.data._M_elems[0x13] = 0;
  local_338.data._M_elems[0x14] = 0;
  local_338.data._M_elems[0x15] = 0;
  local_338.data._M_elems[0x16] = 0;
  local_338.data._M_elems[0x17] = 0;
  local_458 = (this->l).rval.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_460 = (this->l).ridx;
  local_468 = (this->l).rbeg;
  piVar7 = (this->l).rorig;
  local_488 = (this->l).rperm;
  local_4a0 = 0;
  rn_local = rn;
  local_498 = nonz;
  local_480 = eps;
  local_478 = vec;
  while (local_4a0 < rn) {
    enQueueMax(local_498,&local_4a0,local_488[local_498[local_4a0]]);
  }
  uVar12 = 0;
  piVar19 = local_498 + this->thedim;
  local_470 = piVar7;
  while (lVar10 = 0x1c, 0 < rn) {
    local_4a0 = deQueueMax(local_498,&rn_local);
    iVar8 = piVar7[local_4a0];
    pcVar20 = &local_478[iVar8].m_backend;
    pcVar16 = pcVar20;
    pcVar14 = &local_3b8;
    for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar14->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar21 * -8 + 4);
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
    }
    local_3b8.exp = local_478[iVar8].m_backend.exp;
    local_3b8.neg = local_478[iVar8].m_backend.neg;
    local_3b8.fpclass = local_478[iVar8].m_backend.fpclass;
    local_3b8.prec_elem = local_478[iVar8].m_backend.prec_elem;
    pcVar16 = pcVar20;
    pnVar13 = &local_1b0;
    for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar13->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar21 * -8 + 4);
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    pnVar13 = local_480;
    pnVar15 = &local_b0;
    for (; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar15->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    local_b0.m_backend.exp = (local_480->m_backend).exp;
    local_b0.m_backend.neg = (local_480->m_backend).neg;
    local_b0.m_backend.fpclass = (local_480->m_backend).fpclass;
    local_b0.m_backend.prec_elem = (local_480->m_backend).prec_elem;
    local_1b0.m_backend.exp = local_3b8.exp;
    local_1b0.m_backend.neg = local_3b8.neg;
    local_1b0.m_backend.fpclass = local_3b8.fpclass;
    local_1b0.m_backend.prec_elem = local_3b8.prec_elem;
    bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_1b0,&local_b0);
    if (bVar5) {
      piVar19[-1] = iVar8;
      local_448 = piVar19 + -1;
      iVar1 = local_468[iVar8];
      iVar8 = local_468[(long)iVar8 + 1] - iVar1;
      piVar7 = local_460 + iVar1;
      pcVar20 = &local_458[iVar1].m_backend;
      local_450 = uVar12;
      while( true ) {
        lVar10 = 0x1c;
        if (iVar8 < 1) break;
        iVar1 = *piVar7;
        pnVar13 = local_478 + iVar1;
        pnVar15 = pnVar13;
        pcVar16 = &local_338;
        for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar16->data)._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar21 * -8 + 4);
        }
        local_338.exp = local_478[iVar1].m_backend.exp;
        local_338.neg = local_478[iVar1].m_backend.neg;
        local_338.fpclass = local_478[iVar1].m_backend.fpclass;
        local_338.prec_elem = local_478[iVar1].m_backend.prec_elem;
        result_1.m_backend.data._M_elems._0_8_ =
             result_1.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
        local_48c = iVar8;
        local_440 = piVar7;
        tVar6 = boost::multiprecision::operator==
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_338,(int *)&result_1.m_backend);
        if (tVar6) {
          pcVar16 = &local_3b8;
          pnVar15 = &result;
          for (; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pnVar15->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar16 + ((ulong)bVar21 * -2 + 1) * 4);
            pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          result.m_backend.exp = local_3b8.exp;
          result.m_backend.neg = local_3b8.neg;
          result.m_backend.prec_elem = local_3b8.prec_elem;
          result.m_backend.fpclass = local_3b8.fpclass;
          if (local_3b8.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0) {
            result.m_backend.neg = (bool)(local_3b8.neg ^ 1);
          }
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,&result.m_backend,pcVar20);
          pcVar16 = &local_338;
          lVar10 = 0x1c;
          pcVar14 = &result_1.m_backend;
          pcVar17 = pcVar16;
          for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar17->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar17 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_338.exp = result_1.m_backend.exp;
          local_338.neg = result_1.m_backend.neg;
          fVar2 = result_1.m_backend.fpclass;
          iVar3 = result_1.m_backend.prec_elem;
          local_338.fpclass = result_1.m_backend.fpclass;
          local_338.prec_elem = result_1.m_backend.prec_elem;
          pcVar14 = pcVar16;
          pnVar15 = &local_230;
          for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar15->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar14 + ((ulong)bVar21 * -2 + 1) * 4);
            pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_230.m_backend.exp = result_1.m_backend.exp;
          local_230.m_backend.neg = result_1.m_backend.neg;
          local_230.m_backend.fpclass = fVar2;
          local_230.m_backend.prec_elem = iVar3;
          pnVar15 = local_480;
          pnVar18 = &local_130;
          for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar18->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
            pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
            pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_130.m_backend.exp = (local_480->m_backend).exp;
          local_130.m_backend.neg = (local_480->m_backend).neg;
          local_130.m_backend.fpclass = (local_480->m_backend).fpclass;
          local_130.m_backend.prec_elem = (local_480->m_backend).prec_elem;
          bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_230,&local_130);
          pnVar15 = pnVar13;
          if (bVar5) {
            for (; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pnVar15->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar16 + ((ulong)bVar21 * -2 + 1) * 4);
              pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            (pnVar13->m_backend).exp = local_338.exp;
            (pnVar13->m_backend).neg = local_338.neg;
            (pnVar13->m_backend).fpclass = local_338.fpclass;
            (pnVar13->m_backend).prec_elem = local_338.prec_elem;
            enQueueMax(local_498,&rn_local,local_488[iVar1]);
          }
        }
        else {
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,&local_3b8,pcVar20);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_338,&result_1.m_backend);
          result.m_backend.data._M_elems[0] = 0;
          tVar6 = boost::multiprecision::operator!=
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_338,(int *)&result);
          if (tVar6) {
            pcVar16 = &local_338;
            pcVar14 = &result_1.m_backend;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pcVar14->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar21 * -8 + 4);
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
            }
            pcVar16 = &local_338;
            pcVar14 = &local_338;
            pcVar17 = &local_338;
            pcVar4 = &local_338;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&result_1.m_backend,1e-100,(type *)0x0);
            pcVar16 = &result_1.m_backend;
            pcVar14 = &result_1.m_backend;
            pcVar17 = &result_1.m_backend;
            pcVar4 = &result_1.m_backend;
          }
          iVar8 = pcVar16->exp;
          bVar5 = pcVar14->neg;
          fVar2 = pcVar17->fpclass;
          iVar3 = pcVar4->prec_elem;
          pcVar16 = &result_1.m_backend;
          pnVar15 = pnVar13;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pnVar15->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar21 * -8 + 4);
            pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          (pnVar13->m_backend).exp = iVar8;
          (pnVar13->m_backend).neg = bVar5;
          (pnVar13->m_backend).fpclass = fVar2;
          (pnVar13->m_backend).prec_elem = iVar3;
        }
        piVar7 = local_440 + 1;
        pcVar20 = pcVar20 + 1;
        iVar8 = local_48c + -1;
      }
      uVar12 = (ulong)((int)local_450 + 1);
      piVar19 = local_448;
      piVar7 = local_470;
      rn = rn_local;
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar20,0);
      rn = rn_local;
    }
  }
  lVar10 = 0;
  uVar11 = 0;
  if (0 < (int)uVar12) {
    uVar11 = uVar12;
  }
  for (; (int)uVar11 != (int)lVar10; lVar10 = lVar10 + 1) {
    local_498[lVar10] = piVar19[lVar10];
  }
  return (int)uVar12;
}

Assistant:

int CLUFactor<R>::solveLleft(R eps, R* vec, int* nonz, int rn)
{
   int i, j, k, n;
   int r;
   R x, y;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig, *rperm;
   int* last;

   ridx  = l.ridx;
   rval  = l.rval.data();
   rbeg  = l.rbeg;
   rorig = l.rorig;
   rperm = l.rperm;
   n     = 0;

   i = l.firstUpdate - 1;
#ifndef SOPLEX_WITH_L_ROWS
#pragma warn "Not yet implemented, define SOPLEX_WITH_L_ROWS"
   R*   lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   for(; i >= 0; --i)
   {
      k   = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x   = 0;

      for(j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   /*  move rhsidx to a heap
    */
   for(i = 0; i < rn;)
      enQueueMax(nonz, &i, rperm[nonz[i]]);

   last = nonz + thedim;

   while(rn > 0)
   {
      i = deQueueMax(nonz, &rn);
      r = rorig[i];
      x = vec[r];

      if(isNotZero(x, eps))
      {
         *(--last) = r;
         n++;
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            int m = *idx++;
            y = vec[m];

            if(y == 0)
            {
               y = -x * *val++;

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  enQueueMax(nonz, &rn, rperm[m]);
               }
            }
            else
            {
               y -= x * *val++;
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
      else
         vec[r] = 0;
   }

   for(i = 0; i < n; ++i)
      *nonz++ = *last++;

#endif

   return n;
}